

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O0

void __thiscall deqp::SubcaseBase::Documentation(SubcaseBase *this)

{
  TestContext *this_00;
  TestLog *pTVar1;
  ulong uVar2;
  string local_328;
  undefined1 local_308 [8];
  string fsh2;
  undefined1 local_2c8 [8];
  string fsh;
  undefined1 local_288 [8];
  string gsh2;
  undefined1 local_248 [8];
  string gsh;
  undefined1 local_208 [8];
  string tesh2;
  undefined1 local_1c8 [8];
  string tesh;
  undefined1 local_188 [8];
  string tcsh2;
  undefined1 local_148 [8];
  string tcsh;
  undefined1 local_108 [8];
  string vsh2;
  undefined1 local_c8 [8];
  string vsh;
  string local_88;
  string local_68;
  string local_38;
  TestLog *local_18;
  TestLog *log;
  SubcaseBase *this_local;
  
  log = (TestLog *)this;
  this_00 = deqp::Context::getTestContext((this->super_GLWrapper).m_context);
  pTVar1 = tcu::TestContext::getLog(this_00);
  local_18 = pTVar1;
  (*(this->super_GLWrapper)._vptr_GLWrapper[5])();
  WriteField(pTVar1,"Title",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pTVar1 = local_18;
  (*(this->super_GLWrapper)._vptr_GLWrapper[6])();
  WriteField(pTVar1,"Purpose",&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pTVar1 = local_18;
  (*(this->super_GLWrapper)._vptr_GLWrapper[7])();
  WriteField(pTVar1,"Method",&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  pTVar1 = local_18;
  (*(this->super_GLWrapper)._vptr_GLWrapper[8])();
  WriteField(pTVar1,"Pass Criteria",(string *)((long)&vsh.field_2 + 8));
  std::__cxx11::string::~string((string *)(vsh.field_2._M_local_buf + 8));
  VertexShader_abi_cxx11_((string *)local_c8,this);
  uVar2 = std::__cxx11::string::empty();
  pTVar1 = local_18;
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)(vsh2.field_2._M_local_buf + 8),(string *)local_c8);
    WriteField(pTVar1,"OpenGL vertex shader",(string *)((long)&vsh2.field_2 + 8));
    std::__cxx11::string::~string((string *)(vsh2.field_2._M_local_buf + 8));
  }
  VertexShader2_abi_cxx11_((string *)local_108,this);
  uVar2 = std::__cxx11::string::empty();
  pTVar1 = local_18;
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)(tcsh.field_2._M_local_buf + 8),(string *)local_108);
    WriteField(pTVar1,"OpenGL vertex shader 2",(string *)((long)&tcsh.field_2 + 8));
    std::__cxx11::string::~string((string *)(tcsh.field_2._M_local_buf + 8));
  }
  TessControlShader_abi_cxx11_((string *)local_148,this);
  uVar2 = std::__cxx11::string::empty();
  pTVar1 = local_18;
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)(tcsh2.field_2._M_local_buf + 8),(string *)local_148);
    WriteField(pTVar1,"OpenGL tessellation control shader",(string *)((long)&tcsh2.field_2 + 8));
    std::__cxx11::string::~string((string *)(tcsh2.field_2._M_local_buf + 8));
  }
  TessControlShader_abi_cxx11_((string *)local_188,this);
  uVar2 = std::__cxx11::string::empty();
  pTVar1 = local_18;
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)(tesh.field_2._M_local_buf + 8),(string *)local_188);
    WriteField(pTVar1,"OpenGL tessellation control shader 2",(string *)((long)&tesh.field_2 + 8));
    std::__cxx11::string::~string((string *)(tesh.field_2._M_local_buf + 8));
  }
  TessControlShader_abi_cxx11_((string *)local_1c8,this);
  uVar2 = std::__cxx11::string::empty();
  pTVar1 = local_18;
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)(tesh2.field_2._M_local_buf + 8),(string *)local_1c8);
    WriteField(pTVar1,"OpenGL tessellation evaluation shader",(string *)((long)&tesh2.field_2 + 8));
    std::__cxx11::string::~string((string *)(tesh2.field_2._M_local_buf + 8));
  }
  TessControlShader_abi_cxx11_((string *)local_208,this);
  uVar2 = std::__cxx11::string::empty();
  pTVar1 = local_18;
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)(gsh.field_2._M_local_buf + 8),(string *)local_208);
    WriteField(pTVar1,"OpenGL tessellation evaluation shader 2",(string *)((long)&gsh.field_2 + 8));
    std::__cxx11::string::~string((string *)(gsh.field_2._M_local_buf + 8));
  }
  GeometryShader_abi_cxx11_((string *)local_248,this);
  uVar2 = std::__cxx11::string::empty();
  pTVar1 = local_18;
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)(gsh2.field_2._M_local_buf + 8),(string *)local_248);
    WriteField(pTVar1,"OpenGL geometry shader",(string *)((long)&gsh2.field_2 + 8));
    std::__cxx11::string::~string((string *)(gsh2.field_2._M_local_buf + 8));
  }
  GeometryShader2_abi_cxx11_((string *)local_288,this);
  uVar2 = std::__cxx11::string::empty();
  pTVar1 = local_18;
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)(fsh.field_2._M_local_buf + 8),(string *)local_288);
    WriteField(pTVar1,"OpenGL geometry shader 2",(string *)((long)&fsh.field_2 + 8));
    std::__cxx11::string::~string((string *)(fsh.field_2._M_local_buf + 8));
  }
  FragmentShader_abi_cxx11_((string *)local_2c8,this);
  uVar2 = std::__cxx11::string::empty();
  pTVar1 = local_18;
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)(fsh2.field_2._M_local_buf + 8),(string *)local_2c8);
    WriteField(pTVar1,"OpenGL fragment shader",(string *)((long)&fsh2.field_2 + 8));
    std::__cxx11::string::~string((string *)(fsh2.field_2._M_local_buf + 8));
  }
  FragmentShader2_abi_cxx11_((string *)local_308,this);
  uVar2 = std::__cxx11::string::empty();
  pTVar1 = local_18;
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_328,(string *)local_308);
    WriteField(pTVar1,"OpenGL fragment shader 2",&local_328);
    std::__cxx11::string::~string((string *)&local_328);
  }
  std::__cxx11::string::~string((string *)local_308);
  std::__cxx11::string::~string((string *)local_2c8);
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::string::~string((string *)local_248);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::~string((string *)local_188);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_c8);
  return;
}

Assistant:

void SubcaseBase::Documentation()
{
	using namespace std;
	using tcu::TestLog;
	TestLog& log = m_context.getTestContext().getLog();

	WriteField(log, "Title", Title());
	WriteField(log, "Purpose", Purpose());
	WriteField(log, "Method", Method());
	WriteField(log, "Pass Criteria", PassCriteria());

	//OpenGL fields
	string vsh = VertexShader();
	if (!vsh.empty())
		WriteField(log, "OpenGL vertex shader", vsh);

	string vsh2 = VertexShader2();
	if (!vsh2.empty())
		WriteField(log, "OpenGL vertex shader 2", vsh2);

	string tcsh = TessControlShader();
	if (!tcsh.empty())
		WriteField(log, "OpenGL tessellation control shader", tcsh);

	string tcsh2 = TessControlShader();
	if (!tcsh2.empty())
		WriteField(log, "OpenGL tessellation control shader 2", tcsh2);

	string tesh = TessControlShader();
	if (!tesh.empty())
		WriteField(log, "OpenGL tessellation evaluation shader", tesh);

	string tesh2 = TessControlShader();
	if (!tesh2.empty())
		WriteField(log, "OpenGL tessellation evaluation shader 2", tesh2);

	string gsh = GeometryShader();
	if (!gsh.empty())
		WriteField(log, "OpenGL geometry shader", gsh);

	string gsh2 = GeometryShader2();
	if (!gsh2.empty())
		WriteField(log, "OpenGL geometry shader 2", gsh2);

	string fsh = FragmentShader();
	if (!fsh.empty())
		WriteField(log, "OpenGL fragment shader", fsh);

	string fsh2 = FragmentShader2();
	if (!fsh2.empty())
		WriteField(log, "OpenGL fragment shader 2", fsh2);
}